

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

void __thiscall
uWS::WebSocket<false>::sendPrepared
          (WebSocket<false> *this,PreparedMessage *preparedMessage,void *callbackData)

{
  size_t __n;
  _func_void_void_ptr_void_ptr_bool_void_ptr *p_Var1;
  char *pcVar2;
  ulong uVar3;
  uv_poll_t *puVar4;
  void *in_RDX;
  undefined8 *in_RSI;
  NodeData *in_RDI;
  bool wasTransferred;
  Message *messagePtr;
  int memoryIndex;
  int memoryLength;
  _func_void_void_ptr_void_ptr_bool_void_ptr *callback;
  undefined8 in_stack_ffffffffffffffb0;
  int index;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  _lambda_void__void__bool_void___1_ local_21;
  _func_void_void_ptr_void_ptr_bool_void_ptr *local_20;
  void *local_18;
  undefined8 *local_10;
  
  *(int *)(in_RSI + 2) = *(int *)(in_RSI + 2) + 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = uWS::WebSocket::sendPrepared(uWS::WebSocket::PreparedMessage*,void*)::
             {lambda(void*,void*,bool,void*)#1}::operator_cast_to_function_pointer(&local_21);
  uS::Socket::getSocketData((Socket *)in_RDI);
  uS::NodeData::getMemoryBlockIndex(0x30);
  uS::Socket::getSocketData((Socket *)in_RDI);
  index = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  pcVar2 = uS::NodeData::getSmallMemoryBlock(in_RDI,index);
  *(undefined8 *)pcVar2 = *local_10;
  __n = local_10[1];
  *(size_t *)(pcVar2 + 8) = __n;
  uVar3 = uS::Socket::write((Socket *)in_RDI,(int)pcVar2,&stack0xffffffffffffffc7,__n);
  p_Var1 = local_20;
  if ((uVar3 & 1) == 0) {
    if (local_20 != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
      puVar4 = uS::Socket::operator_cast_to_uv_poll_s_((Socket *)in_RDI);
      (*p_Var1)(puVar4,local_10,true,local_18);
    }
  }
  else if ((in_stack_ffffffffffffffc7 & 1) == 0) {
    uS::Socket::getSocketData((Socket *)in_RDI);
    uS::NodeData::freeSmallMemoryBlock
              ((NodeData *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               (char *)in_RDI,index);
    p_Var1 = local_20;
    if (local_20 != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
      puVar4 = uS::Socket::operator_cast_to_uv_poll_s_((Socket *)in_RDI);
      (*p_Var1)(puVar4,local_10,false,local_18);
    }
  }
  else {
    *(_func_void_void_ptr_void_ptr_bool_void_ptr **)(pcVar2 + 0x18) = local_20;
    *(undefined8 **)(pcVar2 + 0x20) = local_10;
    *(void **)(pcVar2 + 0x28) = local_18;
  }
  return;
}

Assistant:

void WebSocket<isServer>::sendPrepared(typename WebSocket<isServer>::PreparedMessage *preparedMessage, void *callbackData) {
    preparedMessage->references++;
    void (*callback)(void *webSocket, void *userData, bool cancelled, void *reserved) = [](void *webSocket, void *userData, bool cancelled, void *reserved) {
        PreparedMessage *preparedMessage = (PreparedMessage *) userData;
        bool lastReference = !--preparedMessage->references;

        if (preparedMessage->callback) {
            preparedMessage->callback(webSocket, reserved, cancelled, (void *) lastReference);
        }

        if (lastReference) {
            delete [] preparedMessage->buffer;
            delete preparedMessage;
        }
    };

    // candidate for fixed size pool allocator
    int memoryLength = sizeof(uS::SocketData::Queue::Message);
    int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

    uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
    messagePtr->data = preparedMessage->buffer;
    messagePtr->length = preparedMessage->length;

    bool wasTransferred;
    if (write(messagePtr, wasTransferred)) {
        if (!wasTransferred) {
            getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
            if (callback) {
                callback(*this, preparedMessage, false, callbackData);
            }
        } else {
            messagePtr->callback = callback;
            messagePtr->callbackData = preparedMessage;
            messagePtr->reserved = callbackData;
        }
    } else {
        if (callback) {
            callback(*this, preparedMessage, true, callbackData);
        }
    }
}